

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O1

void __thiscall Centaurus::Grammar<char>::Grammar(Grammar<char> *this,Grammar<char> *old)

{
  pointer pwVar1;
  
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_001c8c88;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->m_networks)._M_h,&old->m_networks);
  (this->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_root_id)._vptr_Identifier = (_func_int **)&PTR__Identifier_001c8d10;
  (this->m_root_id).m_id._M_dataplus._M_p = (pointer)&(this->m_root_id).m_id.field_2;
  pwVar1 = (old->m_root_id).m_id._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(this->m_root_id).m_id,pwVar1,
             pwVar1 + (old->m_root_id).m_id._M_string_length);
  (this->m_grammar_name)._vptr_Identifier = (_func_int **)&PTR__Identifier_001c8d10;
  (this->m_grammar_name).m_id._M_dataplus._M_p = (pointer)&(this->m_grammar_name).m_id.field_2;
  (this->m_grammar_name).m_id._M_string_length = 0;
  (this->m_grammar_name).m_id.field_2._M_local_buf[0] = L'\0';
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_buckets =
       &(this->m_options).
        super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_h._M_single_bucket;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_bucket_count = 1;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_element_count = 0;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_options)._vptr_GrammarOptions = (_func_int **)&PTR__GrammarOptions_001c8d40;
  return;
}

Assistant:

Grammar(Grammar&& old)
        : m_networks(std::move(old.m_networks)), m_root_id(old.m_root_id)
    {
    }